

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_segs.cpp
# Opt level: O0

int WallMost(short *mostbuf,secplane_t *plane,FWallCoords *wallc)

{
  short sVar1;
  bool bVar2;
  int32_t iVar3;
  int iVar4;
  fixed_t delta;
  fixed_t fVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  fixed_t yinc;
  int xcross_1;
  double intz_1;
  double inty_1;
  double t_1;
  int xcross;
  double intz;
  double inty;
  double t;
  double frac_3;
  double frac_2;
  double frac_1;
  double frac;
  double iy2;
  double iy1;
  int local_88;
  int ix2;
  int ix1;
  int bad;
  double s4;
  double s3;
  double s2;
  double s1;
  double oz2;
  double oz1;
  double z2;
  double z1;
  double den;
  double y;
  double x;
  FWallCoords *wallc_local;
  secplane_t *plane_local;
  short *mostbuf_local;
  
  bVar2 = secplane_t::isSlope(plane);
  if (bVar2) {
    if ((MirrorFlags & 1) == 0) {
      y = vertex_t::fX(curline->v1);
      den = vertex_t::fY(curline->v1);
      if (wallc->sx1 == 0) {
        dVar6 = (double)((((wallc->tleft).X - (wallc->tright).X) + (wallc->tleft).Y) -
                        (wallc->tright).Y);
        if ((dVar6 != 0.0) || (NAN(dVar6))) {
          dVar6 = (double)((wallc->tleft).Y + (wallc->tleft).X) / dVar6;
          dVar7 = vertex_t::fX(curline->v2);
          y = dVar6 * (dVar7 - y) + y;
          dVar7 = vertex_t::fY(curline->v2);
          den = dVar6 * (dVar7 - den) + den;
        }
      }
      dVar6 = ViewPos.Z;
      dVar7 = secplane_t::ZatPoint(plane,y,den);
      z2 = dVar6 - dVar7;
      oz1 = z2;
      if (wallc->sx1 + 1 < (int)wallc->sx2) {
        y = vertex_t::fX(curline->v2);
        den = vertex_t::fY(curline->v2);
        if (wallc->sx2 == viewwidth) {
          dVar6 = (double)((((wallc->tleft).X - (wallc->tright).X) - (wallc->tleft).Y) +
                          (wallc->tright).Y);
          if ((dVar6 != 0.0) || (NAN(dVar6))) {
            dVar6 = (double)((wallc->tright).Y - (wallc->tright).X) / dVar6;
            dVar7 = vertex_t::fX(curline->v1);
            y = y - dVar6 * (y - dVar7);
            dVar7 = vertex_t::fY(curline->v1);
            den = den - dVar6 * (den - dVar7);
          }
        }
        dVar6 = ViewPos.Z;
        dVar7 = secplane_t::ZatPoint(plane,y,den);
        oz1 = dVar6 - dVar7;
      }
    }
    else {
      y = vertex_t::fX(curline->v2);
      den = vertex_t::fY(curline->v2);
      if (wallc->sx1 == 0) {
        dVar6 = (double)((((wallc->tleft).X - (wallc->tright).X) + (wallc->tleft).Y) -
                        (wallc->tright).Y);
        if ((dVar6 != 0.0) || (NAN(dVar6))) {
          dVar6 = (double)((wallc->tleft).Y + (wallc->tleft).X) / dVar6;
          dVar7 = vertex_t::fX(curline->v1);
          y = y - dVar6 * (y - dVar7);
          dVar7 = vertex_t::fY(curline->v1);
          den = den - dVar6 * (den - dVar7);
        }
      }
      dVar6 = ViewPos.Z;
      dVar7 = secplane_t::ZatPoint(plane,y,den);
      z2 = dVar6 - dVar7;
      oz1 = z2;
      if (wallc->sx1 + 1 < (int)wallc->sx2) {
        y = vertex_t::fX(curline->v1);
        den = vertex_t::fY(curline->v1);
        if (wallc->sx2 == viewwidth) {
          dVar6 = (double)((((wallc->tleft).X - (wallc->tright).X) - (wallc->tleft).Y) +
                          (wallc->tright).Y);
          if ((dVar6 != 0.0) || (NAN(dVar6))) {
            dVar6 = (double)((wallc->tright).Y - (wallc->tright).X) / dVar6;
            dVar7 = vertex_t::fX(curline->v2);
            y = dVar6 * (dVar7 - y) + y;
            dVar7 = vertex_t::fY(curline->v2);
            den = dVar6 * (dVar7 - den) + den;
          }
        }
        dVar6 = ViewPos.Z;
        dVar7 = secplane_t::ZatPoint(plane,y,den);
        oz1 = dVar6 - dVar7;
      }
    }
    dVar7 = z2;
    dVar6 = oz1;
    dVar8 = globaluclip * (double)wallc->sz1;
    dVar9 = globaluclip * (double)wallc->sz2;
    dVar10 = globaldclip * (double)wallc->sz1;
    dVar11 = globaldclip * (double)wallc->sz2;
    mostbuf_local._4_4_ =
         (uint)(z2 < dVar8) + (uint)(oz1 < dVar9) * 2 + (uint)(dVar10 < z2) * 4 +
         (uint)(dVar11 < oz1) * 8;
    local_88 = (int)wallc->sx1;
    iy1._4_4_ = (int)wallc->sx2;
    iy2 = (double)wallc->sz1;
    frac = (double)wallc->sz2;
    if ((mostbuf_local._4_4_ & 3) == 3) {
      memset(mostbuf + local_88,0,(long)(iy1._4_4_ - local_88) << 1);
    }
    else if ((mostbuf_local._4_4_ & 0xc) == 0xc) {
      clearbufshort(mostbuf + local_88,iy1._4_4_ - local_88,(WORD)viewheight);
    }
    else {
      if ((mostbuf_local._4_4_ & 3) != 0) {
        dVar8 = (z2 - dVar8) / (((dVar9 - dVar8) + z2) - oz1);
        dVar9 = (double)wallc->sz1 + dVar8 * (double)(wallc->sz2 - wallc->sz1);
        dVar12 = z2 + dVar8 * (oz1 - z2);
        sVar1 = wallc->sx1;
        iVar3 = xs_RoundToInt((real64)((dVar8 * (double)wallc->sz2 *
                                       (double)((int)wallc->sx2 - (int)wallc->sx1)) / dVar9));
        iVar4 = sVar1 + iVar3;
        if ((mostbuf_local._4_4_ & 3) == 2) {
          if (wallc->sx1 <= iVar4) {
            frac = dVar9;
            iy1._4_4_ = iVar4;
            oz1 = dVar12;
          }
          memset(mostbuf + iVar4,0,(long)(wallc->sx2 - iVar4) << 1);
        }
        else {
          if (iVar4 <= wallc->sx2) {
            iy2 = dVar9;
            local_88 = iVar4;
            z2 = dVar12;
          }
          memset(mostbuf + wallc->sx1,0,(long)(iVar4 - wallc->sx1) << 1);
        }
      }
      if ((mostbuf_local._4_4_ & 0xc) != 0) {
        dVar8 = (dVar7 - dVar10) / (((dVar11 - dVar10) + dVar7) - dVar6);
        dVar9 = (double)wallc->sz1 + dVar8 * (double)(wallc->sz2 - wallc->sz1);
        dVar7 = dVar7 + dVar8 * (dVar6 - dVar7);
        sVar1 = wallc->sx1;
        iVar3 = xs_RoundToInt((real64)((dVar8 * (double)wallc->sz2 *
                                       (double)((int)wallc->sx2 - (int)wallc->sx1)) / dVar9));
        iVar4 = sVar1 + iVar3;
        if ((mostbuf_local._4_4_ & 0xc) == 8) {
          if (wallc->sx1 <= iVar4) {
            frac = dVar9;
            iy1._4_4_ = iVar4;
            oz1 = dVar7;
          }
          if (iVar4 < wallc->sx2) {
            clearbufshort(mostbuf + iVar4,wallc->sx2 - iVar4,(WORD)viewheight);
          }
        }
        else {
          if (iVar4 <= wallc->sx2) {
            iy2 = dVar9;
            local_88 = iVar4;
            z2 = dVar7;
          }
          if (wallc->sx1 < iVar4) {
            clearbufshort(mostbuf + wallc->sx1,iVar4 - wallc->sx1,(WORD)viewheight);
          }
        }
      }
      dVar6 = (z2 * InvZtoScale) / iy2;
      if (iy1._4_4_ == local_88) {
        iVar3 = xs_RoundToInt((real64)(dVar6 + CenterY));
        mostbuf[local_88] = (short)iVar3;
      }
      else {
        delta = FloatToFixed(((oz1 * InvZtoScale) / frac - dVar6) / (double)(iy1._4_4_ - local_88));
        fVar5 = FloatToFixed(dVar6 + CenterY);
        qinterpolatedown16short(mostbuf + local_88,iy1._4_4_ - local_88,fVar5 + 0x8000,delta);
      }
    }
  }
  else {
    dVar6 = secplane_t::Zat0(plane);
    mostbuf_local._4_4_ = OWallMost(mostbuf,dVar6 - ViewPos.Z,wallc);
  }
  return mostbuf_local._4_4_;
}

Assistant:

int WallMost (short *mostbuf, const secplane_t &plane, const FWallCoords *wallc)
{
	if (!plane.isSlope())
	{
		return OWallMost(mostbuf, plane.Zat0() - ViewPos.Z, wallc);
	}

	double x, y, den, z1, z2, oz1, oz2;
	double s1, s2, s3, s4;
	int bad, ix1, ix2;
	double iy1, iy2;

	// Get Z coordinates at both ends of the line
	if (MirrorFlags & RF_XFLIP)
	{
		x = curline->v2->fX();
		y = curline->v2->fY();
		if (wallc->sx1 == 0 && 0 != (den = wallc->tleft.X - wallc->tright.X + wallc->tleft.Y - wallc->tright.Y))
		{
			double frac = (wallc->tleft.Y + wallc->tleft.X) / den;
			x -= frac * (x - curline->v1->fX());
			y -= frac * (y - curline->v1->fY());
		}
		z1 = ViewPos.Z - plane.ZatPoint(x, y);

		if (wallc->sx2 > wallc->sx1 + 1)
		{
			x = curline->v1->fX();
			y = curline->v1->fY();
			if (wallc->sx2 == viewwidth && 0 != (den = wallc->tleft.X - wallc->tright.X - wallc->tleft.Y + wallc->tright.Y))
			{
				double frac = (wallc->tright.Y - wallc->tright.X) / den;
				x += frac * (curline->v2->fX() - x);
				y += frac * (curline->v2->fY() - y);
			}
			z2 = ViewPos.Z - plane.ZatPoint(x, y);
		}
		else
		{
			z2 = z1;
		}
	}
	else
	{
		x = curline->v1->fX();
		y = curline->v1->fY();
		if (wallc->sx1 == 0 && 0 != (den = wallc->tleft.X - wallc->tright.X + wallc->tleft.Y - wallc->tright.Y))
		{
			double frac = (wallc->tleft.Y + wallc->tleft.X) / den;
			x += frac * (curline->v2->fX() - x);
			y += frac * (curline->v2->fY() - y);
		}
		z1 = ViewPos.Z - plane.ZatPoint(x, y);

		if (wallc->sx2 > wallc->sx1 + 1)
		{
			x = curline->v2->fX();
			y = curline->v2->fY();
			if (wallc->sx2 == viewwidth && 0 != (den = wallc->tleft.X - wallc->tright.X - wallc->tleft.Y + wallc->tright.Y))
			{
				double frac = (wallc->tright.Y - wallc->tright.X) / den;
				x -= frac * (x - curline->v1->fX());
				y -= frac * (y - curline->v1->fY());
			}
			z2 = ViewPos.Z - plane.ZatPoint(x, y);
		}
		else
		{
			z2 = z1;
		}
	}

	s1 = globaluclip * wallc->sz1; s2 = globaluclip * wallc->sz2;
	s3 = globaldclip * wallc->sz1; s4 = globaldclip * wallc->sz2;
	bad = (z1<s1)+((z2<s2)<<1)+((z1>s3)<<2)+((z2>s4)<<3);

	ix1 = wallc->sx1; ix2 = wallc->sx2;
	iy1 = wallc->sz1; iy2 = wallc->sz2;
	oz1 = z1; oz2 = z2;

	if ((bad&3) == 3)
	{ // The entire line is above the screen
		memset (&mostbuf[ix1], 0, (ix2-ix1)*sizeof(mostbuf[0]));
		return bad;
	}

	if ((bad&12) == 12)
	{ // The entire line is below the screen
		clearbufshort (&mostbuf[ix1], ix2-ix1, viewheight);
		return bad;

	}

	if (bad&3)
	{ // The line intersects the top of the screen
			//inty = intz / (globaluclip>>16)
		double t = (oz1-s1) / (s2-s1+oz1-oz2);
		double inty = wallc->sz1 + t * (wallc->sz2-wallc->sz1);
		double intz = oz1 + t * (oz2-oz1);
		int xcross = wallc->sx1 + xs_RoundToInt((t * wallc->sz2 * (wallc->sx2-wallc->sx1)) / inty);

		//t = divscale30((x1<<4)-xcross*yb1[w],xcross*(yb2[w]-yb1[w])-((x2-x1)<<4));
		//inty = yb1[w] + mulscale30(yb2[w]-yb1[w],t);
		//intz = z1 + mulscale30(z2-z1,t);

		if ((bad&3) == 2)
		{ // The right side of the line is above the screen
			if (wallc->sx1 <= xcross) { z2 = intz; iy2 = inty; ix2 = xcross; }
			memset (&mostbuf[xcross], 0, (wallc->sx2-xcross)*sizeof(mostbuf[0]));
		}
		else
		{ // The left side of the line is above the screen
			if (xcross <= wallc->sx2) { z1 = intz; iy1 = inty; ix1 = xcross; }
			memset (&mostbuf[wallc->sx1], 0, (xcross-wallc->sx1)*sizeof(mostbuf[0]));
		}
	}

	if (bad&12)
	{ // The line intersects the bottom of the screen
			//inty = intz / (globaldclip>>16)
		double t = (oz1-s3) / (s4-s3+oz1-oz2);
		double inty = wallc->sz1 + t * (wallc->sz2-wallc->sz1);
		double intz = oz1 + t * (oz2-oz1);
		int xcross = wallc->sx1 + xs_RoundToInt((t * wallc->sz2 * (wallc->sx2-wallc->sx1)) / inty);

		//t = divscale30((x1<<4)-xcross*yb1[w],xcross*(yb2[w]-yb1[w])-((x2-x1)<<4));
		//inty = yb1[w] + mulscale30(yb2[w]-yb1[w],t);
		//intz = z1 + mulscale30(z2-z1,t);

		if ((bad&12) == 8)
		{ // The right side of the line is below the screen
			if (wallc->sx1 <= xcross) { z2 = intz; iy2 = inty; ix2 = xcross; }
			if (wallc->sx2 > xcross) clearbufshort (&mostbuf[xcross], wallc->sx2-xcross, viewheight);
		}
		else
		{ // The left side of the line is below the screen
			if (xcross <= wallc->sx2) { z1 = intz; iy1 = inty; ix1 = xcross; }
			if (xcross > wallc->sx1) clearbufshort (&mostbuf[wallc->sx1], xcross-wallc->sx1, viewheight);
		}
	}

	y = z1 * InvZtoScale / iy1;
	if (ix2 == ix1)
	{
		mostbuf[ix1] = (short)xs_RoundToInt(y + CenterY);
	}
	else
	{
		fixed_t yinc = FLOAT2FIXED(((z2 * InvZtoScale / iy2) - y) / (ix2-ix1));
		qinterpolatedown16short (&mostbuf[ix1], ix2-ix1, FLOAT2FIXED(y + CenterY) + FRACUNIT/2, yinc);
	}

	return bad;
}